

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,false,true>
               (long *ldata,interval_t *rdata,interval_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong right;
  ulong uVar4;
  idx_t right_00;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  int64_t *piVar9;
  interval_t iVar10;
  interval_t left;
  interval_t left_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar9 = &result_data->micros;
    right_00 = count;
    for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
      iVar10.micros = ldata[iVar6];
      iVar10._0_8_ = rdata->micros;
      iVar10 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                         (*(MultiplyOperator **)rdata,iVar10,right_00);
      ((interval_t *)(piVar9 + -1))->months = (int)iVar10._0_8_;
      ((interval_t *)(piVar9 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
      *piVar9 = iVar10.micros;
      piVar9 = piVar9 + 2;
    }
  }
  else {
    uVar7 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar5 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar5 = count;
        }
LAB_01509db8:
        piVar9 = &result_data[uVar7].micros;
        uVar3 = uVar4;
        for (; uVar2 = uVar7, uVar7 < uVar5; uVar7 = uVar7 + 1) {
          left.micros = ldata[uVar7];
          left._0_8_ = rdata->micros;
          iVar10 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                             (*(MultiplyOperator **)rdata,left,uVar3);
          ((interval_t *)(piVar9 + -1))->months = (int)iVar10._0_8_;
          ((interval_t *)(piVar9 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
          *piVar9 = iVar10.micros;
          piVar9 = piVar9 + 2;
        }
      }
      else {
        uVar3 = puVar1[uVar4];
        uVar5 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar5 = count;
        }
        if (uVar3 == 0xffffffffffffffff) goto LAB_01509db8;
        uVar2 = uVar5;
        if (uVar3 != 0) {
          piVar9 = &result_data[uVar7].micros;
          right = uVar4;
          for (uVar8 = 0; uVar2 = uVar8 + uVar7, uVar8 + uVar7 < uVar5; uVar8 = uVar8 + 1) {
            if ((uVar3 >> (uVar8 & 0x3f) & 1) != 0) {
              left_00.micros = ldata[uVar7 + uVar8];
              left_00._0_8_ = rdata->micros;
              iVar10 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                                 (*(MultiplyOperator **)rdata,left_00,right);
              ((interval_t *)(piVar9 + -1))->months = (int)iVar10._0_8_;
              ((interval_t *)(piVar9 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
              *piVar9 = iVar10.micros;
            }
            piVar9 = piVar9 + 2;
          }
        }
      }
      uVar7 = uVar2;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}